

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int zisofs_rewind_boot_file(archive_write *a)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uchar *p;
  __off_t __offset;
  size_t bytes;
  int *piVar6;
  ssize_t sVar7;
  ssize_t rs;
  size_t rsize;
  int ret;
  int fd;
  int64_t new_offset;
  int64_t write_offset;
  int64_t read_offset;
  zisofs_extract zext;
  size_t rbuff_size;
  size_t remaining;
  ssize_t r;
  uchar *rbuff;
  isofile *file;
  iso9660_conflict *iso9660;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  rsize._0_4_ = 0;
  lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x10340) + 0x18);
  if (*(char *)(lVar2 + 0xc0) == '\0') {
    a_local._4_4_ = 0;
  }
  else {
    memset(&read_offset,0,0xc0);
    zext._0_8_ = ZEXT48(*(uint *)(lVar2 + 0xc4));
    read_offset._0_4_ = (uint)*(byte *)(lVar2 + 0xc1);
    iVar5 = *(int *)((long)pvVar1 + 8);
    lVar3 = *(long *)((long)a->format_data + 0x102f0);
    lVar4 = *(long *)((long)a->format_data + 0x102e0);
    write_offset = *(int64_t *)(lVar2 + 0x90);
    rbuff_size = *(ulong *)(lVar2 + 0x98);
    zext._184_8_ = rbuff_size;
    if (0x8000 < rbuff_size) {
      zext.stream_valid = 0x8000;
      zext._188_4_ = 0;
    }
    p = (uchar *)malloc(zext._184_8_);
    if (p == (uchar *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
      a_local._4_4_ = -0x1e;
    }
    else {
      do {
        if (rbuff_size == 0) goto LAB_001acd61;
        __offset = lseek(iVar5,0,1);
        lseek(iVar5,write_offset,0);
        rs = zext._184_8_;
        if (rbuff_size < (ulong)zext._184_8_) {
          rs = rbuff_size;
        }
        bytes = read(*(int *)((long)pvVar1 + 8),p,rs);
        if ((long)bytes < 1) {
          piVar6 = __errno_location();
          archive_set_error(&a->archive,*piVar6,"Can\'t read temporary file(%jd)",bytes);
          rsize._0_4_ = -0x1e;
          goto LAB_001acd61;
        }
        rbuff_size = rbuff_size - bytes;
        write_offset = bytes + write_offset;
        lseek(iVar5,__offset,0);
        sVar7 = zisofs_extract(a,(zisofs_extract *)&read_offset,p,bytes);
      } while (-1 < sVar7);
      rsize._0_4_ = (int)sVar7;
LAB_001acd61:
      if ((int)rsize == 0) {
        *(long *)(lVar2 + 0x90) = (lVar3 + 0x10000) - lVar4;
        *(ulong *)(lVar2 + 0x98) = (ulong)*(uint *)(lVar2 + 0xc4);
        archive_entry_set_size(*(archive_entry **)(lVar2 + 0x20),*(la_int64_t *)(lVar2 + 0x98));
        *(undefined1 *)(lVar2 + 0xc0) = 0;
        *(undefined1 *)(lVar2 + 0xc1) = 0;
        *(undefined4 *)(lVar2 + 0xc4) = 0;
        iVar5 = wb_write_padding_to_temp(a,*(int64_t *)(lVar2 + 0x98));
        if (iVar5 < 0) {
          rsize._0_4_ = -0x1e;
        }
      }
      free(p);
      free((void *)zext._24_8_);
      if (((int)zext.stream.reserved != 0) && (iVar5 = inflateEnd(&zext.block_avail), iVar5 != 0)) {
        archive_set_error(&a->archive,-1,"Failed to clean up compressor");
        rsize._0_4_ = -0x1e;
      }
      a_local._4_4_ = (int)rsize;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
zisofs_rewind_boot_file(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file;
	unsigned char *rbuff;
	ssize_t r;
	size_t remaining, rbuff_size;
	struct zisofs_extract zext;
	int64_t read_offset, write_offset, new_offset;
	int fd, ret = ARCHIVE_OK;

	file = iso9660->el_torito.boot->file;
	/*
	 * There is nothing to do if this boot file does not have
	 * zisofs header.
	 */
	if (file->zisofs.header_size == 0)
		return (ARCHIVE_OK);

	/*
	 * Uncompress the zisofs'ed file contents.
	 */
	memset(&zext, 0, sizeof(zext));
	zext.pz_uncompressed_size = file->zisofs.uncompressed_size;
	zext.pz_log2_bs = file->zisofs.log2_bs;

	fd = iso9660->temp_fd;
	new_offset = wb_offset(a);
	read_offset = file->content.offset_of_temp;
	remaining = (size_t)file->content.size;
	if (remaining > 1024 * 32)
		rbuff_size = 1024 * 32;
	else
		rbuff_size = remaining;

	rbuff = malloc(rbuff_size);
	if (rbuff == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	while (remaining) {
		size_t rsize;
		ssize_t rs;

		/* Get the current file pointer. */
		write_offset = lseek(fd, 0, SEEK_CUR);

		/* Change the file pointer to read. */
		lseek(fd, read_offset, SEEK_SET);

		rsize = rbuff_size;
		if (rsize > remaining)
			rsize = remaining;
		rs = read(iso9660->temp_fd, rbuff, rsize);
		if (rs <= 0) {
			archive_set_error(&a->archive, errno,
			    "Can't read temporary file(%jd)", (intmax_t)rs);
			ret = ARCHIVE_FATAL;
			break;
		}
		remaining -= rs;
		read_offset += rs;

		/* Put the file pointer back to write. */
		lseek(fd, write_offset, SEEK_SET);

		r = zisofs_extract(a, &zext, rbuff, rs);
		if (r < 0) {
			ret = (int)r;
			break;
		}
	}

	if (ret == ARCHIVE_OK) {
		/*
		 * Change the boot file content from zisofs'ed data
		 * to plain data.
		 */
		file->content.offset_of_temp = new_offset;
		file->content.size = file->zisofs.uncompressed_size;
		archive_entry_set_size(file->entry, file->content.size);
		/* Set to be no zisofs. */
		file->zisofs.header_size = 0;
		file->zisofs.log2_bs = 0;
		file->zisofs.uncompressed_size = 0;
		r = wb_write_padding_to_temp(a, file->content.size);
		if (r < 0)
			ret = ARCHIVE_FATAL;
	}

	/*
	 * Free the resource we used in this function only.
	 */
	free(rbuff);
	free(zext.block_pointers);
	if (zext.stream_valid && inflateEnd(&(zext.stream)) != Z_OK) {
        	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Failed to clean up compressor");
		ret = ARCHIVE_FATAL;
	}

	return (ret);
}